

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_helpers.h
# Opt level: O3

void test_helper_psa_done(int line,char *file)

{
  char *pcVar1;
  mbedtls_psa_stats_t stats;
  mbedtls_psa_stats_t local_48;
  
  mbedtls_psa_get_stats(&local_48);
  if (local_48.volatile_slots == 0) {
    if (local_48.persistent_slots == 0) {
      if (local_48.external_slots == 0) {
        if (local_48.half_filled_slots == 0) goto LAB_0010ee07;
        pcVar1 = "A half-filled slot has not been cleared properly.";
      }
      else {
        pcVar1 = "An external slot has not been closed properly.";
      }
    }
    else {
      pcVar1 = "A persistent slot has not been closed properly.";
    }
  }
  else {
    pcVar1 = "A volatile slot has not been closed properly.";
  }
  if (test_info.result == TEST_RESULT_SUCCESS) {
    test_info.result = TEST_RESULT_FAILED;
    test_info.filename =
         "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/tests/suites/test_suite_psa_crypto_persistent_key.function"
    ;
    test_info.test = pcVar1;
    test_info.line_no = line;
  }
LAB_0010ee07:
  mbedtls_psa_crypto_free();
  return;
}

Assistant:

static void test_helper_psa_done( int line, const char *file )
{
    (void) test_helper_is_psa_pristine( line, file );
    mbedtls_psa_crypto_free( );
}